

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_subfi_i64_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i64 ret,int64_t arg1,TCGv_i64 arg2)

{
  TCGv_i64 arg1_00;
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  
  if (arg1 != 0) {
    arg1_00 = tcg_const_i64_mips64el(tcg_ctx,arg1);
    tcg_gen_sub_i64(tcg_ctx,ret,arg1_00,arg2);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg1_00 + (long)tcg_ctx));
    return;
  }
  pTVar1 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_neg_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_subfi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, int64_t arg1, TCGv_i64 arg2)
{
    if (arg1 == 0 && TCG_TARGET_HAS_neg_i64) {
        /* Don't recurse with tcg_gen_neg_i64.  */
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_neg_i64, ret, arg2);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg1);
        tcg_gen_sub_i64(tcg_ctx, ret, t0, arg2);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}